

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbase64.h
# Opt level: O0

size_t base64_encoded_size(size_t len,int mode)

{
  ulong uStack_28;
  int pad;
  size_t n;
  size_t k;
  int mode_local;
  size_t len_local;
  
  uStack_28 = (len << 2) / 3 + 3 & 0xfffffffffffffffc;
  if ((mode & 0x80U) == 0) {
    if (len % 3 == 1) {
      uStack_28 = uStack_28 - 2;
    }
    else if (len % 3 == 2) {
      uStack_28 = uStack_28 - 1;
    }
  }
  return uStack_28;
}

Assistant:

static inline size_t base64_encoded_size(size_t len, int mode)
{
    size_t k = len % 3;
    size_t n = (len * 4 / 3 + 3) & ~(size_t)3;
    int pad = mode & base64_enc_modifier_padding;

    if (!pad) {
        switch (k) {
        case 2:
            n -= 1;
            break;
        case 1:
            n -= 2;
            break;
        default:
            break;
        }
    }
    return n;
}